

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4cc9d::CliqueRunner::CliqueRunner
          (CliqueRunner *this,InputGraph *g,CliqueParams *p)

{
  undefined1 auVar1 [16];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  pointer pRVar7;
  size_type sVar8;
  reference pvVar9;
  uint *puVar10;
  SVOBitset *this_00;
  long in_RDX;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *in_RSI;
  long *in_RDI;
  int v;
  uint i;
  vector<int,_std::allocator<int>_> degrees;
  int q_1;
  int p_1;
  int q;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  value_type in_stack_fffffffffffffc54;
  allocator_type *in_stack_fffffffffffffc58;
  function<int_(int)> *__args_1;
  anon_class_8_1_df839e07 in_stack_fffffffffffffc60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc70;
  ProofOptions *in_stack_fffffffffffffc78;
  function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffc98;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_fffffffffffffca0;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *this_01;
  Proof *in_stack_fffffffffffffca8;
  _Optional_payload_base<int> in_stack_fffffffffffffcb0;
  function<int_(int)> local_250 [5];
  int local_1a4;
  Proof *in_stack_fffffffffffffe60;
  uint local_174;
  int local_108;
  int local_104;
  int local_cc;
  allocator<int> local_b3;
  allocator<int> local_b2;
  allocator<gss::innards::SVOBitset> local_b1 [153];
  long local_18;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *local_10;
  
  *in_RDI = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Incumbent::Incumbent((Incumbent *)0x12303b);
  std::shared_ptr<gss::innards::Proof>::shared_ptr((shared_ptr<gss::innards::Proof> *)0x123054);
  iVar3 = InputGraph::size((InputGraph *)0x123075);
  *(int *)(in_RDI + 7) = iVar3;
  InputGraph::size((InputGraph *)0x1230b0);
  gss::innards::SVOBitset::SVOBitset
            ((SVOBitset *)in_stack_fffffffffffffc60.degrees,
             (uint)((ulong)in_stack_fffffffffffffc58 >> 0x20),(uint)in_stack_fffffffffffffc58);
  std::allocator<gss::innards::SVOBitset>::allocator((allocator<gss::innards::SVOBitset> *)0x1230fc)
  ;
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::vector
            ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
             in_stack_fffffffffffffc70._M_current,(size_type)in_stack_fffffffffffffc68._M_current,
             (value_type *)in_stack_fffffffffffffc60.degrees,in_stack_fffffffffffffc58);
  std::allocator<gss::innards::SVOBitset>::~allocator(local_b1);
  gss::innards::SVOBitset::~SVOBitset
            ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::vector
            ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)0x123156);
  std::allocator<int>::allocator((allocator<int> *)0x12318e);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70._M_current,
             (size_type)in_stack_fffffffffffffc68._M_current,
             (allocator_type *)in_stack_fffffffffffffc60.degrees);
  std::allocator<int>::~allocator(&local_b2);
  std::allocator<int>::allocator((allocator<int> *)0x1231f5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70._M_current,
             (size_type)in_stack_fffffffffffffc68._M_current,
             (allocator_type *)in_stack_fffffffffffffc60.degrees);
  std::allocator<int>::~allocator(&local_b3);
  gss::innards::Watches<int,_(anonymous_namespace)::FlatWatchTable>::Watches
            ((Watches<int,_(anonymous_namespace)::FlatWatchTable> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x123251);
  in_RDI[0x291] = 0;
  bVar2 = std::optional::operator_cast_to_bool((optional<gss::ProofOptions> *)0x123277);
  if (bVar2) {
    std::optional<gss::ProofOptions>::operator*((optional<gss::ProofOptions> *)0x123291);
    std::make_shared<gss::innards::Proof,gss::ProofOptions_const&>(in_stack_fffffffffffffc78);
    std::shared_ptr<gss::innards::Proof>::operator=
              ((shared_ptr<gss::innards::Proof> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffffc48._M_current);
    std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x1232c9);
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_18 + 0xb0));
    if (bVar2) {
      std::shared_ptr<gss::innards::Proof>::operator=
                ((shared_ptr<gss::innards::Proof> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffffc48._M_current);
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
  if (bVar2) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1233e6);
    bVar2 = gss::innards::Proof::has_clique_model((Proof *)0x1233ee);
    if ((!bVar2) && ((*(byte *)(*in_RDI + 0xc0) & 1) == 0)) {
      for (local_cc = 0; iVar3 = InputGraph::size((InputGraph *)0x123446), local_cc < iVar3;
          local_cc = local_cc + 1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x123476);
        std::function<std::__cxx11::string(int)>::
        function<(anonymous_namespace)::CliqueRunner::CliqueRunner(InputGraph_const&,gss::CliqueParams_const&)::_lambda(int)_1_,void>
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)in_stack_fffffffffffffc60.degrees,
                   (anon_class_8_1_54a39807 *)in_stack_fffffffffffffc58);
        gss::innards::Proof::create_binary_variable
                  ((Proof *)in_stack_fffffffffffffcb0,
                   (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
        ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                     *)0x1234e4);
      }
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x123531);
      iVar3 = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
      InputGraph::size((InputGraph *)0x123546);
      std::optional<int>::optional<unsigned_int,_true>
                ((optional<int> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (optional<unsigned_int> *)in_stack_fffffffffffffc48._M_current);
      gss::innards::Proof::create_objective
                (in_stack_fffffffffffffca8,iVar3,(optional<int>)in_stack_fffffffffffffcb0);
      for (local_104 = 0; iVar3 = InputGraph::size((InputGraph *)0x1235af), local_104 < iVar3;
          local_104 = local_104 + 1) {
        for (local_108 = 0; local_108 < local_104; local_108 = local_108 + 1) {
          bVar2 = InputGraph::adjacent
                            ((InputGraph *)in_stack_fffffffffffffc60.degrees,
                             (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                             (int)in_stack_fffffffffffffc58);
          if (!bVar2) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12362b);
            gss::innards::Proof::create_non_edge_constraint
                      ((Proof *)in_stack_fffffffffffffcb0,
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                       (int)in_stack_fffffffffffffca8);
          }
        }
      }
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x123686);
      gss::innards::Proof::finalise_model(in_stack_fffffffffffffe60);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((int)in_RDI[7] * ((int)in_RDI[7] + 1) * 2);
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  in_RDI[0x291] = (long)pvVar6;
  pRVar7 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
           operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                       *)0x1236f0);
  uVar4 = (*pRVar7->_vptr_RestartsSchedule[5])();
  if ((uVar4 & 1) != 0) {
    InputGraph::size((InputGraph *)0x123732);
    std::
    vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
    ::resize((vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
              *)in_stack_fffffffffffffc70._M_current,(size_type)in_stack_fffffffffffffc68._M_current
            );
  }
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48._M_current);
  __first._M_current._4_4_ = in_stack_fffffffffffffc54;
  __first._M_current._0_4_ = in_stack_fffffffffffffc50;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_fffffffffffffc48,0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1237ae);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70._M_current,
             (size_type)in_stack_fffffffffffffc68._M_current);
  this_01 = local_10;
  std::function<void(int,int,std::basic_string_view<char,std::char_traits<char>>)>::
  function<(anonymous_namespace)::CliqueRunner::CliqueRunner(InputGraph_const&,gss::CliqueParams_const&)::_lambda(int,int,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             in_stack_fffffffffffffc60.degrees,(anon_class_8_1_df839e07 *)in_stack_fffffffffffffc58)
  ;
  InputGraph::for_each_edge((InputGraph *)this_01,in_stack_fffffffffffffc98);
  std::function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             0x12381b);
  if ((*(byte *)(*in_RDI + 0x38) & 1) == 0) {
    in_stack_fffffffffffffc98 =
         (function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
         (in_RDI + 0xe);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48._M_current);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48._M_current);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::CliqueRunner::CliqueRunner(InputGraph_const&,gss::CliqueParams_const&)::_lambda(int,int)_1_>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  }
  for (local_174 = 0;
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe)), local_174 < sVar8;
      local_174 = local_174 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(ulong)local_174);
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)*pvVar9)
    ;
    *puVar10 = local_174;
  }
  std::function<void(int,int,std::basic_string_view<char,std::char_traits<char>>)>::
  function<(anonymous_namespace)::CliqueRunner::CliqueRunner(InputGraph_const&,gss::CliqueParams_const&)::_lambda(int,int,std::basic_string_view<char,std::char_traits<char>>)_2_,void>
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             in_stack_fffffffffffffc60.degrees,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc58)
  ;
  InputGraph::for_each_edge((InputGraph *)this_01,in_stack_fffffffffffffc98);
  std::function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             0x1239b6);
  bVar2 = std::function::operator_cast_to_bool
                    ((function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)> *)
                     0x1239ca);
  if (bVar2) {
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (local_10,(size_type)in_stack_fffffffffffffc68._M_current);
    for (local_1a4 = 0; local_1a4 < (int)in_RDI[7]; local_1a4 = local_1a4 + 1) {
      in_stack_fffffffffffffc60.degrees = (vector<int,_std::allocator<int>_> *)(*in_RDI + 0x40);
      this_00 = (SVOBitset *)
                std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                           (size_type)in_stack_fffffffffffffc48._M_current);
      in_stack_fffffffffffffc54 = *(value_type *)&this_00->_data;
      __args_1 = local_250;
      std::function<int(int)>::
      function<(anonymous_namespace)::CliqueRunner::CliqueRunner(InputGraph_const&,gss::CliqueParams_const&)::_lambda(int)_2_,void>
                ((function<int_(int)> *)in_stack_fffffffffffffc60.degrees,
                 (anon_class_8_1_8991fb9c *)__args_1);
      std::function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)>::operator()
                ((function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)> *)
                 this_00,(int)((ulong)in_stack_fffffffffffffc60.degrees >> 0x20),__args_1);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                 (in_RDI + 0xb),(long)local_1a4);
      gss::innards::SVOBitset::operator=(this_00,(SVOBitset *)in_stack_fffffffffffffc60.degrees);
      gss::innards::SVOBitset::~SVOBitset
                ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      std::function<int_(int)>::~function((function<int_(int)> *)0x123ad3);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffc60.degrees);
  return;
}

Assistant:

CliqueRunner(const InputGraph & g, const CliqueParams & p) :
            params(p),
            size(g.size()),
            adj(g.size(), SVOBitset{unsigned(size), 0}),
            order(size),
            invorder(size),
            space(nullptr)
        {
            if (p.proof_options)
                proof = make_shared<Proof>(*p.proof_options);
            else if (p.extend_proof)
                proof = p.extend_proof;

            if (proof && ! proof->has_clique_model() && ! params.proof_is_for_hom) {
                for (int q = 0; q < g.size(); ++q)
                    proof->create_binary_variable(q, [&](int v) { return g.vertex_name(v); });

                proof->create_objective(g.size(), params.decide);

                for (int p = 0; p < g.size(); ++p)
                    for (int q = 0; q < p; ++q)
                        if (! g.adjacent(p, q))
                            proof->create_non_edge_constraint(p, q);

                proof->finalise_model();
            }

            space = new int[size * (size + 1) * 2];

            if (params.restarts_schedule->might_restart())
                watches.table.data.resize(g.size());

            // populate our order with every vertex initially
            iota(order.begin(), order.end(), 0);

            // pre-calculate degrees
            vector<int> degrees;
            degrees.resize(size);
            g.for_each_edge([&](int f, int, string_view) { ++degrees[f]; });

            // sort on degree
            if (! params.input_order)
                sort(order.begin(), order.end(),
                    [&](int a, int b) { return (degrees[a] > degrees[b] || (degrees[a] == degrees[b] && a < b)); });

            for (unsigned i = 0; i < order.size(); ++i)
                invorder[order[i]] = i;

            g.for_each_edge([&](int f, int t, string_view) { adj[invorder[f]].set(invorder[t]); });

            if (params.connected) {
                connected_table.resize(size);
                for (int v = 0; v < size; ++v)
                    connected_table[v] = params.connected(order.at(v), [&](int x) { return invorder.at(x); });
            }
        }